

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int getAutoVacuum(char *z)

{
  byte bVar1;
  uint uVar2;
  long lVar3;
  int x;
  undefined8 uStack_18;
  
  lVar3 = 0;
  do {
    bVar1 = z[lVar3];
    if (bVar1 == "unix-none"[lVar3 + 5]) {
      if ((ulong)bVar1 == 0) {
        return 0;
      }
    }
    else if (""[bVar1] != ""[(byte)"unix-none"[lVar3 + 5]]) {
      lVar3 = 0;
      do {
        bVar1 = z[lVar3];
        if (bVar1 == "database or disk is full"[lVar3 + 0x14]) {
          if ((ulong)bVar1 == 0) {
            return 1;
          }
        }
        else if (""[bVar1] != ""[(byte)"database or disk is full"[lVar3 + 0x14]]) {
          lVar3 = 0;
          do {
            bVar1 = z[lVar3];
            if (bVar1 == "incremental"[lVar3]) {
              if ((ulong)bVar1 == 0) {
                return 2;
              }
            }
            else if (""[bVar1] != ""[(byte)"incremental"[lVar3]]) {
              uStack_18 = "";
              sqlite3GetInt32(z,(int *)((long)&uStack_18 + 4));
              uVar2 = uStack_18._4_4_ & 0xff;
              if (2 < uStack_18._4_4_) {
                uVar2 = 0;
              }
              return uVar2;
            }
            lVar3 = lVar3 + 1;
          } while( true );
        }
        lVar3 = lVar3 + 1;
      } while( true );
    }
    lVar3 = lVar3 + 1;
  } while( true );
}

Assistant:

static int getAutoVacuum(const char *z){
  int i;
  if( 0==sqlite3StrICmp(z, "none") ) return BTREE_AUTOVACUUM_NONE;
  if( 0==sqlite3StrICmp(z, "full") ) return BTREE_AUTOVACUUM_FULL;
  if( 0==sqlite3StrICmp(z, "incremental") ) return BTREE_AUTOVACUUM_INCR;
  i = sqlite3Atoi(z);
  return (u8)((i>=0&&i<=2)?i:0);
}